

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O1

string * __thiscall
hedg::Lay::instruction
          (string *__return_storage_ptr__,Lay *this,string *market_id,
          vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  pointer pOVar1;
  int iVar2;
  pointer pOVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_string_view<char> fmt_02;
  basic_string_view<char> fmt_03;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_01;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_02;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_03;
  string instructions;
  undefined1 *local_c8;
  size_t sStack_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  buffer<char> local_a8;
  undefined1 *local_88;
  string *local_78;
  string *local_70;
  buffer<char> local_68;
  string *local_48;
  
  local_c8 = &local_b8;
  sStack_c0 = 0;
  local_b8 = 0;
  if ((orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar3 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) - 1;
    local_78 = market_id;
    local_70 = __return_storage_ptr__;
    if (uVar4 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar2 = *(int *)((long)&pOVar3->order_type + lVar5);
        if (iVar2 == 1) {
          local_a8.size_ = (size_t)*(uint *)((long)&(pOVar3->bid).size + lVar5);
          local_a8._vptr_buffer =
               (_func_int **)(ulong)*(uint *)((long)&pOVar3->selection_id + lVar5);
          local_68.size_ = sStack_c0;
          local_68.capacity_ = sStack_c0;
          local_68._vptr_buffer = (_func_int **)&PTR_grow_001eced0;
          fmt_00.size_ = 0x81;
          fmt_00.data_ = 
          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}},"
          ;
          args_00.field_1.values_ =
               (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_a8;
          args_00.desc_ = 0x91;
          local_48 = (string *)&local_c8;
          ::fmt::v8::detail::vformat_to<char>(&local_68,fmt_00,args_00,(locale_ref)0x0);
        }
        else if (iVar2 == 0) {
          local_48 = (string *)(ulong)*(uint *)((long)&(pOVar3->bid).price + lVar5);
          local_68.size_ = (size_t)*(uint *)((long)&(pOVar3->bid).size + lVar5);
          local_68._vptr_buffer =
               (_func_int **)(ulong)*(uint *)((long)&pOVar3->selection_id + lVar5);
          local_a8.size_ = sStack_c0;
          local_a8.capacity_ = sStack_c0;
          local_a8._vptr_buffer = (_func_int **)&PTR_grow_001eced0;
          fmt.size_ = 0x93;
          fmt.data_ = 
          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
          ;
          args.field_1.values_ =
               (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
          args.desc_ = 0x991;
          local_88 = (undefined1 *)&local_c8;
          ::fmt::v8::detail::vformat_to<char>(&local_a8,fmt,args,(locale_ref)0x0);
        }
        uVar6 = uVar6 + 1;
        pOVar3 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = ((long)(orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) - 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < uVar4);
    }
    __return_storage_ptr__ = local_70;
    market_id = local_78;
    pOVar1 = pOVar3 + uVar4;
    if (pOVar3[uVar4].order_type == LIMIT) {
      local_48 = (string *)(ulong)(uint)(pOVar1->bid).price;
      local_68.size_ = (size_t)(uint)(pOVar1->bid).size;
      local_68._vptr_buffer = (_func_int **)(ulong)(uint)pOVar1->selection_id;
      local_a8.size_ = sStack_c0;
      local_a8.capacity_ = sStack_c0;
      local_a8._vptr_buffer = (_func_int **)&PTR_grow_001eced0;
      fmt_02.size_ = 0x92;
      fmt_02.data_ = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
      ;
      args_02.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
      args_02.desc_ = 0x991;
      local_88 = (undefined1 *)&local_c8;
      ::fmt::v8::detail::vformat_to<char>(&local_a8,fmt_02,args_02,(locale_ref)0x0);
    }
    else if (pOVar3[uVar4].order_type == SP) {
      local_a8.size_ = (size_t)(uint)(pOVar1->bid).size;
      local_a8._vptr_buffer = (_func_int **)(ulong)(uint)pOVar1->selection_id;
      local_68.size_ = sStack_c0;
      local_68.capacity_ = sStack_c0;
      local_68._vptr_buffer = (_func_int **)&PTR_grow_001eced0;
      fmt_01.size_ = 0x80;
      fmt_01.data_ = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}}"
      ;
      args_01.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_a8;
      args_01.desc_ = 0x91;
      local_48 = (string *)&local_c8;
      ::fmt::v8::detail::vformat_to<char>(&local_68,fmt_01,args_01,(locale_ref)0x0);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a8._vptr_buffer = (_func_int **)(market_id->_M_dataplus)._M_p;
  local_a8.ptr_ = (char *)market_id->_M_string_length;
  local_a8.size_ = (size_t)local_c8;
  local_a8.capacity_ = sStack_c0;
  local_68.size_ = 0;
  local_68.capacity_ = 0;
  local_68._vptr_buffer = (_func_int **)&PTR_grow_001eced0;
  fmt_03.size_ = 0x7b;
  fmt_03.data_ = 
  "[{{\"jsonrpc\": \"2.0\",\"method\": \"SportsAPING/v1.0/placeOrders\",\"params\": {{\"marketId\": \"{}\",\"instructions\": [{}]}},\"id\": 1}}]"
  ;
  args_03.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_a8;
  args_03.desc_ = 0xdd;
  local_48 = __return_storage_ptr__;
  ::fmt::v8::detail::vformat_to<char>(&local_68,fmt_03,args_03,(locale_ref)0x0);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lay::instruction(std::string market_id, std::vector<Order>& orders) {

	std::string instructions;

	if (!orders.empty()) {
		for (int i = 0; i < orders.size() - 1; ++i) {

			if (orders[i].order_type == LIMIT) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"LIMIT\","
					"\"limitOrder\": {{"
					"\"size\": \"{}\","
					"\"price\": \"{}\","
					"\"persistenceType\": \"LAPSE\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size(), orders[i].bid.get_price());
			}
			else if (orders[i].order_type == SP) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"MARKET_ON_CLOSE\","
					"\"marketOnCloseOrder\": {{"
					"\"liability\": \"{}\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size());
			}
		}
		if (orders[orders.size() - 1].order_type == LIMIT) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"LIMIT\","
				"\"limitOrder\": {{"
				"\"size\": \"{}\","
				"\"price\": \"{}\","
				"\"persistenceType\": \"LAPSE\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size(), orders[orders.size() - 1].bid.get_price());
		}
		else if (orders[orders.size() - 1].order_type == SP) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"MARKET_ON_CLOSE\","
				"\"marketOnCloseOrder\": {{"
				"\"liability\": \"{}\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size());
		}

	}
	std::string body;

	fmt::format_to(std::back_inserter(body),"["
		"{{"
		"\"jsonrpc\": \"2.0\","
		"\"method\": \"SportsAPING/v1.0/placeOrders\","
		"\"params\": {{"
		"\"marketId\": \"{}\","
		"\"instructions\": ["
		"{}"
		"]"
		"}},"
		"\"id\": 1"
		"}}"
		"]", market_id, instructions);
	
	return body;
}